

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_scalar_mult(uint8_t *out,uint8_t *scalar,uint8_t *point)

{
  int iVar1;
  uint8_t *point_local;
  uint8_t *scalar_local;
  uint8_t *out_local;
  
  iVar1 = CRYPTO_is_BMI1_capable();
  if (((iVar1 != 0) && (iVar1 = CRYPTO_is_BMI2_capable(), iVar1 != 0)) &&
     (iVar1 = CRYPTO_is_ADX_capable(), iVar1 != 0)) {
    x25519_scalar_mult_adx(out,scalar,point);
    return;
  }
  x25519_scalar_mult_generic(out,scalar,point);
  return;
}

Assistant:

static void x25519_scalar_mult(uint8_t out[32], const uint8_t scalar[32],
                               const uint8_t point[32]) {
#if defined(BORINGSSL_X25519_NEON)
  if (CRYPTO_is_NEON_capable()) {
    x25519_NEON(out, scalar, point);
    return;
  }
#elif defined(BORINGSSL_FE25519_ADX)
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    x25519_scalar_mult_adx(out, scalar, point);
    return;
  }
#endif

  x25519_scalar_mult_generic(out, scalar, point);
}